

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

nng_stat * nng_stat_find(nng_stat *stat,char *name)

{
  int iVar1;
  nng_stat *stat_00;
  nng_stat *pnVar2;
  
  if (stat != (nng_stat *)0x0) {
    iVar1 = strcmp(name,stat->s_info->si_name);
    if (iVar1 == 0) {
      return stat;
    }
    for (stat_00 = (nng_stat *)nni_list_first(&stat->s_children); stat_00 != (nng_stat *)0x0;
        stat_00 = (nng_stat *)nni_list_next(&stat->s_children,stat_00)) {
      pnVar2 = nng_stat_find(stat_00,name);
      if (pnVar2 != (nng_stat *)0x0) {
        return pnVar2;
      }
    }
  }
  return (nng_stat *)0x0;
}

Assistant:

const nng_stat *
nng_stat_find(const nng_stat *stat, const char *name)
{
#if NNG_ENABLE_STATS
	const nng_stat *child;
	if (stat == NULL) {
		return (NULL);
	}
	if (strcmp(name, stat->s_info->si_name) == 0) {
		return (stat);
	}
	NNI_LIST_FOREACH (&stat->s_children, child) {
		const nng_stat *result;
		if ((result = nng_stat_find(child, name)) != NULL) {
			return (result);
		}
	}
#else
	NNI_ARG_UNUSED(stat);
	NNI_ARG_UNUSED(name);
#endif
	return (NULL);
}